

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  archive_string_conv *paVar1;
  int iVar2;
  wchar_t wVar3;
  char *__s;
  char *__s_00;
  archive_string_conv *paVar4;
  char *__ptr;
  char *pcVar5;
  archive_string_conv *paVar6;
  uint uVar7;
  bool bVar8;
  
  if (a == (archive *)0x0) {
    uVar7 = 0xffffffff;
  }
  else {
    for (paVar4 = a->sconv; paVar4 != (archive_string_conv *)0x0; paVar4 = paVar4->next) {
      iVar2 = strcmp(paVar4->from_charset,fc);
      if ((iVar2 == 0) && (iVar2 = strcmp(paVar4->to_charset,tc), iVar2 == 0)) {
        return paVar4;
      }
    }
    uVar7 = a->current_codepage;
  }
  __s = canonical_charset_name(fc);
  __s_00 = canonical_charset_name(tc);
  paVar4 = (archive_string_conv *)calloc(1,0x58);
  if (paVar4 != (archive_string_conv *)0x0) {
    __ptr = strdup(__s);
    paVar4->from_charset = __ptr;
    if (__ptr != (char *)0x0) {
      pcVar5 = strdup(__s_00);
      paVar4->to_charset = pcVar5;
      if (pcVar5 != (char *)0x0) {
        if ((flag & 1U) == 0) {
          wVar3 = L'\x01';
          if ((flag & 2U) == 0) goto LAB_00160e77;
          paVar4->to_cp = uVar7;
          paVar4->from_cp = 0xffffffff;
          bVar8 = false;
        }
        else {
          paVar4->from_cp = uVar7;
          paVar4->to_cp = 0xffffffff;
          bVar8 = uVar7 != 0xffffffff;
        }
        iVar2 = strcmp(__s,__s_00);
        if (iVar2 == 0) {
          wVar3 = L'\x01';
        }
        else {
          wVar3 = (wchar_t)(byte)(uVar7 == 0xffffffff & bVar8);
        }
LAB_00160e77:
        paVar4->same = wVar3;
        iVar2 = strcmp(__s_00,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x100;
        }
        else {
          iVar2 = strcmp(__s_00,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x400;
          }
          else {
            iVar2 = strcmp(__s_00,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x1000;
            }
          }
        }
        iVar2 = strcmp(__s,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x200;
        }
        else {
          iVar2 = strcmp(__s,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x800;
          }
          else {
            iVar2 = strcmp(__s,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x2000;
            }
          }
        }
        wVar3 = flag | 0x40;
        if ((flag & 0x2a00U) == 0) {
          wVar3 = flag;
        }
        if ((flag & 2U) == 0) {
          wVar3 = flag;
        }
        paVar4->flag = wVar3;
        setup_converter(paVar4);
        if (paVar4->nconverter == L'\0') {
          if (a != (archive *)0x0) {
            archive_set_error(a,-1,"A character-set conversion not fully supported on this platform"
                             );
          }
          free_sconv_object(paVar4);
          return (archive_string_conv *)0x0;
        }
        if (a != (archive *)0x0) {
          paVar1 = (archive_string_conv *)&a->sconv;
          do {
            paVar6 = paVar1;
            paVar1 = paVar6->next;
          } while (paVar1 != (archive_string_conv *)0x0);
          paVar6->next = paVar4;
          return paVar4;
        }
        return paVar4;
      }
      free(__ptr);
    }
    free(paVar4);
  }
  if (a == (archive *)0x0) {
    return (archive_string_conv *)0x0;
  }
  archive_set_error(a,0xc,"Could not allocate memory for a string conversion object");
  return (archive_string_conv *)0x0;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}